

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeSetIterator::reset(UnicodeSetIterator *this)

{
  int32_t iVar1;
  
  if (this->set == (UnicodeSet *)0x0) {
    this->endRange = -1;
    iVar1 = 0;
  }
  else {
    iVar1 = UnicodeSet::getRangeCount(this->set);
    this->endRange = iVar1 + -1;
    iVar1 = this->set->strings->count;
  }
  this->stringCount = iVar1;
  this->range = 0;
  this->endElement = -1;
  this->nextElement = 0;
  if (-1 < this->endRange) {
    (*(this->super_UObject)._vptr_UObject[3])(this,0);
  }
  this->nextString = 0;
  this->string = (UnicodeString *)0x0;
  return;
}

Assistant:

void UnicodeSetIterator::reset() {
    if (set == NULL) {
        // Set up indices to empty iteration
        endRange = -1;
        stringCount = 0;
    } else {
        endRange = set->getRangeCount() - 1;
        stringCount = set->strings->size();
    }
    range = 0;
    endElement = -1;
    nextElement = 0;            
    if (endRange >= 0) {
        loadRange(range);
    }
    nextString = 0;
    string = NULL;
}